

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcBuildingElementProxyType::~IfcBuildingElementProxyType
          (IfcBuildingElementProxyType *this)

{
  IfcTypeProduct *this_00;
  void *pvVar1;
  
  this_00 = (IfcTypeProduct *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18));
  pvVar1 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxyType,_1UL>).
            field_0x20 + *(long *)(*(long *)this + -0x18);
  *(undefined8 *)((long)pvVar1 + -0x1b0) = 0x926790;
  *(undefined8 *)((long)pvVar1 + 0x10) = 0x9268a8;
  *(undefined8 *)((long)pvVar1 + -0x128) = 0x9267b8;
  *(undefined8 *)((long)pvVar1 + -0x118) = 0x9267e0;
  *(undefined8 *)((long)pvVar1 + -0xc0) = 0x926808;
  *(undefined8 *)((long)pvVar1 + -0x68) = 0x926830;
  *(undefined8 *)((long)pvVar1 + -0x30) = 0x926858;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x926880;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  *(undefined8 *)&this_00->super_IfcTypeObject = 0x926b70;
  *(undefined8 *)&this_00[1].super_IfcTypeObject.field_0x60 = 0x926c38;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0x88 = 0x926b98;
  (this_00->super_IfcTypeObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x926bc0;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0xf0 = 0x926be8;
  *(undefined8 *)&this_00->field_0x148 = 0x926c10;
  if (*(undefined1 **)&this_00->field_0x158 != &this_00[1].super_IfcTypeObject.field_0x8) {
    operator_delete(*(undefined1 **)&this_00->field_0x158);
  }
  IfcTypeProduct::~IfcTypeProduct(this_00,&PTR_construction_vtable_24__009268d0);
  operator_delete(this_00);
  return;
}

Assistant:

IfcBuildingElementProxyType() : Object("IfcBuildingElementProxyType") {}